

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::Level::~Level(Level *this)

{
  pointer ppFVar1;
  
  for (ppFVar1 = (this->faces).
                 super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (this->faces).
      super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    if (*ppFVar1 != (FaceData *)0x0) {
      (*((*ppFVar1)->super_PtexFaceData)._vptr_PtexFaceData[1])();
    }
  }
  std::
  _Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
  ::~_Vector_base(&(this->faces).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                 );
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->offsets).super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::
  ~_Vector_base((_Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                 *)this);
  return;
}

Assistant:

~Level() {
            for (std::vector<FaceData*>::iterator i = faces.begin(); i != faces.end(); ++i) {
                if (*i) delete *i;
            }
        }